

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<bool,_bool>::streamReconstructedExpression
          (BinaryExpr<bool,_bool> *this,ostream *os)

{
  StringRef SVar1;
  ostream *in_RSI;
  long in_RDI;
  string local_68 [32];
  char *local_48;
  size_type sStack_40;
  string local_30 [48];
  
  Detail::stringify<bool>((bool *)in_RSI);
  local_48 = *(char **)(in_RDI + 0x10);
  sStack_40 = *(size_type *)(in_RDI + 0x18);
  Detail::stringify<bool>((bool *)in_RSI);
  SVar1.m_size = sStack_40;
  SVar1.m_start = local_48;
  Catch::formatReconstructedExpression(in_RSI,local_30,SVar1,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }